

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O0

OutboundPacketStream * __thiscall
osc::OutboundPacketStream::operator<<(OutboundPacketStream *this,int32 rhs)

{
  char *pcVar1;
  int32 rhs_local;
  OutboundPacketStream *this_local;
  
  CheckForAvailableArgumentSpace(this,4);
  pcVar1 = this->typeTagsCurrent_;
  this->typeTagsCurrent_ = pcVar1 + -1;
  pcVar1[-1] = 'i';
  FromInt32(this->argumentCurrent_,rhs);
  this->argumentCurrent_ = this->argumentCurrent_ + 4;
  return this;
}

Assistant:

OutboundPacketStream& OutboundPacketStream::operator<<( int32 rhs )
{
    CheckForAvailableArgumentSpace(4);

    *(--typeTagsCurrent_) = INT32_TYPE_TAG;
    FromInt32( argumentCurrent_, rhs );
    argumentCurrent_ += 4;

    return *this;
}